

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O1

void load_patch(_mdi *mdi,unsigned_short patchid)

{
  _sample **pp_Var1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  unsigned_short uVar7;
  unsigned_long uVar8;
  float fVar9;
  ushort uVar10;
  short sVar11;
  _patch *p_Var12;
  _patch **pp_Var13;
  _sample *p_Var14;
  _sample *p_Var15;
  ushort uVar16;
  uint uVar17;
  long lVar18;
  ushort uVar19;
  int iVar20;
  uint uVar21;
  ushort uVar22;
  uchar *puVar23;
  ulong uVar24;
  
  if (mdi->patch_count != 0) {
    uVar17 = 1;
    uVar24 = 0;
    do {
      if (mdi->patches[uVar24]->patchid == patchid) {
        return;
      }
      uVar24 = (ulong)uVar17;
      uVar17 = uVar17 + 1;
    } while (uVar24 < mdi->patch_count);
  }
  p_Var12 = get_patch_data(patchid);
  if (p_Var12 == (_patch *)0x0) {
    return;
  }
  FCriticalSection::Enter(&patch_lock);
  if (p_Var12->loaded == '\0') {
    p_Var12->loaded = '\x01';
    p_Var14 = _WM_load_gus_pat(p_Var12->filename,(uint)fix_release);
    if (p_Var14 == (_sample *)0x0) goto LAB_00342f9f;
    if (auto_amp == '\x01') {
      uVar10 = 0;
      uVar16 = 0;
      p_Var15 = p_Var14;
      do {
        if (p_Var15->data_length < 0x400) {
          uVar22 = 0;
          uVar19 = 0;
        }
        else {
          uVar24 = 0;
          uVar19 = 0;
          uVar22 = 0;
          do {
            uVar6 = p_Var15->data[uVar24];
            if ((short)uVar22 < (short)uVar6) {
              uVar22 = uVar6;
            }
            if ((short)uVar19 <= (short)uVar6) {
              uVar6 = uVar19;
            }
            uVar19 = uVar6;
            uVar24 = uVar24 + 1;
          } while (p_Var15->data_length >> 10 != uVar24);
        }
        if ((short)uVar10 < (short)uVar22) {
          uVar10 = uVar22;
        }
        if ((short)uVar19 < (short)uVar16) {
          uVar16 = uVar19;
        }
        p_Var15 = p_Var15->next;
      } while (p_Var15 != (_sample *)0x0);
      iVar20 = (int)(short)uVar16;
      uVar21 = -iVar20;
      uVar17 = (uint)uVar10;
      if (auto_amp_with_amp == '\x01') {
        if (SBORROW4(uVar17,uVar21) == (int)(uVar17 + iVar20) < 0) {
          iVar20 = (int)(0x1fffc00 / (ulong)uVar10);
        }
        else {
          iVar20 = (int)(0x2000000 / (ulong)uVar21);
        }
        sVar11 = (short)((uint)(iVar20 * p_Var12->amp) >> 10);
      }
      else if (SBORROW4(uVar17,uVar21) == (int)(uVar17 + iVar20) < 0) {
        sVar11 = (short)(0x1fffc00 / (ulong)uVar10);
      }
      else {
        sVar11 = (short)(0x2000000 / (ulong)uVar21);
      }
      p_Var12->amp = sVar11;
    }
    p_Var12->first_sample = p_Var14;
    uVar7 = p_Var12->patchid;
    if ((char)uVar7 < '\0') {
      bVar2 = p_Var12->keep;
      p_Var15 = p_Var14;
      if ((bVar2 & 4) == 0) {
        do {
          p_Var15->modes = p_Var15->modes & 0xfb;
          pp_Var1 = &p_Var15->next;
          p_Var15 = *pp_Var1;
        } while (*pp_Var1 != (_sample *)0x0);
      }
      p_Var15 = p_Var14;
      if ((bVar2 & 0x40) == 0) {
        do {
          p_Var15->modes = p_Var15->modes & 0xbf;
          pp_Var1 = &p_Var15->next;
          p_Var15 = *pp_Var1;
        } while (*pp_Var1 != (_sample *)0x0);
      }
    }
    p_Var15 = p_Var14;
    if (uVar7 == 0x2f) {
      do {
        if ((p_Var15->modes & 4) == 0) {
          lVar18 = 0;
          do {
            p_Var15->env_target[lVar18 + 3] = p_Var15->env_target[2];
            p_Var15->env_rate[lVar18 + 3] = p_Var15->env_rate[2];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
        }
        pp_Var1 = &p_Var15->next;
        p_Var15 = *pp_Var1;
      } while (*pp_Var1 != (_sample *)0x0);
    }
    bVar2 = p_Var12->keep;
    uVar21 = (uint)_WM_SampleRate;
    bVar3 = p_Var12->remove;
    uVar17 = (uint)_WM_SampleRate;
    p_Var15 = p_Var14;
    do {
      if (((bVar3 & 0x20) != 0) && ((p_Var15->modes & 0x20) != 0)) {
        p_Var15->modes = p_Var15->modes & 0xdf;
      }
      if (((char)bVar3 < '\0') && ((char)p_Var15->modes < '\0')) {
        p_Var15->modes = p_Var15->modes & 0x7f;
      }
      if ((bVar2 & 0x40) != 0) {
        p_Var15->modes = p_Var15->modes | 0x40;
      }
      bVar4 = p_Var15->modes;
      lVar18 = 0;
      puVar23 = &p_Var12->env[0].set;
      do {
        if ((bVar4 & 0x40) == 0) {
          p_Var15->env_target[lVar18] = 0x3fffff;
          fVar9 = (float)uVar17 * 0.001456;
LAB_00342f6a:
          p_Var15->env_rate[lVar18] = (int)(long)(4194303.0 / fVar9);
        }
        else {
          bVar5 = *puVar23;
          if ((bVar5 & 2) != 0) {
            p_Var15->env_target[lVar18] = (int)(long)(*(float *)(puVar23 + -4) * 255.0) * 0x4040;
          }
          if ((bVar5 & 1) != 0) {
            fVar9 = ((_env *)(puVar23 + -8))->time * (float)uVar21 * 0.001;
            goto LAB_00342f6a;
          }
        }
        lVar18 = lVar18 + 1;
        puVar23 = puVar23 + 0xc;
      } while (lVar18 != 6);
      p_Var15 = p_Var15->next;
    } while (p_Var15 != (_sample *)0x0);
    if (p_Var14 == (_sample *)0x0) goto LAB_00342f9f;
  }
  if (p_Var12->first_sample != (_sample *)0x0) {
    uVar8 = mdi->patch_count;
    mdi->patch_count = uVar8 + 1;
    pp_Var13 = (_patch **)realloc(mdi->patches,uVar8 * 8 + 8);
    mdi->patches = pp_Var13;
    pp_Var13[mdi->patch_count - 1] = p_Var12;
    p_Var12->inuse_count = p_Var12->inuse_count + 1;
  }
LAB_00342f9f:
  FCriticalSection::Leave(&patch_lock);
  return;
}

Assistant:

static void load_patch(struct _mdi *mdi, unsigned short patchid) {
	unsigned int i;
	struct _patch *tmp_patch = NULL;

	for (i = 0; i < mdi->patch_count; i++) {
		if (mdi->patches[i]->patchid == patchid) {
			return;
		}
	}

	tmp_patch = get_patch_data(patchid);
	if (tmp_patch == NULL) {
		return;
	}

	patch_lock.Enter();
	if (!tmp_patch->loaded) {
		if (load_sample(tmp_patch) == -1) {
			patch_lock.Leave();
			return;
		}
	}

	if (tmp_patch->first_sample == NULL) {
		patch_lock.Leave();
		return;
	}

	mdi->patch_count++;
	mdi->patches = (struct _patch**)realloc(mdi->patches,
			(sizeof(struct _patch*) * mdi->patch_count));
	mdi->patches[mdi->patch_count - 1] = tmp_patch;
	tmp_patch->inuse_count++;
	patch_lock.Leave();
}